

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkhash.c
# Opt level: O1

lh_entry * lh_table_lookup_entry_w_hash(lh_table *t,void *k,unsigned_long h)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  if (0 < t->size) {
    uVar3 = h % (ulong)(long)t->size;
    iVar4 = 0;
    do {
      pvVar1 = t->table[uVar3].k;
      if (pvVar1 != (void *)0xfffffffffffffffe) {
        if (pvVar1 == (void *)0xffffffffffffffff) {
          return (lh_entry *)0x0;
        }
        iVar2 = (*t->equal_fn)(pvVar1,k);
        if (iVar2 != 0) {
          return t->table + uVar3;
        }
      }
      uVar5 = uVar3 + 1;
      uVar3 = 0;
      if (t->size != (int)uVar5) {
        uVar3 = uVar5;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < t->size);
  }
  return (lh_entry *)0x0;
}

Assistant:

struct lh_entry *lh_table_lookup_entry_w_hash(struct lh_table *t, const void *k,
                                              const unsigned long h)
{
	unsigned long n = h % t->size;
	int count = 0;

	while (count < t->size)
	{
		if (t->table[n].k == LH_EMPTY)
			return NULL;
		if (t->table[n].k != LH_FREED && t->equal_fn(t->table[n].k, k))
			return &t->table[n];
		if ((int)++n == t->size)
			n = 0;
		count++;
	}
	return NULL;
}